

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsHeader.h
# Opt level: O2

void __thiscall AoEHeader::AoEHeader(AoEHeader *this)

{
  AmsNetId::AmsNetId(&this->targetNetId,0);
  this->leTargetPort = 0;
  AmsNetId::AmsNetId(&this->sourceNetId,0);
  *(undefined8 *)&this->leSourcePort = 0;
  *(undefined8 *)((long)&this->leLength + 2) = 0;
  *(undefined2 *)((long)&this->leInvokeId + 2) = 0;
  return;
}

Assistant:

AoEHeader()
        : leTargetPort(0),
        leSourcePort(0),
        leCmdId(0),
        leStateFlags(0),
        leLength(0),
        leErrorCode(0),
        leInvokeId(0)
    {}